

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O3

JsValueRef
WScriptJsrt::GetModuleNamespace
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode errorCode;
  char *pcVar1;
  size_t sVar2;
  iterator iVar3;
  char16_t *errorMessage;
  char local_178 [8];
  char fullPath [260];
  undefined1 auStack_68 [8];
  AutoString specifierStr;
  undefined1 local_38 [16];
  JsValueRef local_28;
  JsValueRef returnValue;
  
  local_28 = (JsValueRef)0x0;
  if (argumentCount < 2) {
    errorMessage = L"Need an argument for WScript.GetModuleNamespace";
    errorCode = JsErrorInvalidArgument;
  }
  else {
    specifierStr.data._0_5_ = 0;
    specifierStr._13_8_ = 0;
    auStack_68 = (undefined1  [8])0x0;
    specifierStr.length._0_5_ = 0;
    specifierStr.length._5_3_ = 0;
    AutoString::Initialize((AutoString *)auStack_68,arguments[1]);
    errorMessage = L"";
    errorCode = (JsErrorCode)specifierStr.data_wide;
    if ((JsErrorCode)specifierStr.data_wide == JsNoError) {
      pcVar1 = _fullpath(local_178,
                         (char *)CONCAT35(specifierStr.length._5_3_,(undefined5)specifierStr.length)
                         ,0x104);
      errorCode = JsErrorInvalidArgument;
      if (pcVar1 != (char *)0x0) {
        specifierStr._24_8_ = local_38;
        sVar2 = strlen(local_178);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&specifierStr.errorCode,local_178,local_178 + sVar2);
        iVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                ::find(&moduleRecordMap_abi_cxx11_._M_t,(key_type *)&specifierStr.errorCode);
        if ((undefined1 *)specifierStr._24_8_ != local_38) {
          operator_delete((void *)specifierStr._24_8_);
        }
        if ((_Rb_tree_header *)iVar3._M_node ==
            &moduleRecordMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          errorMessage = 
          L"Need to supply a path for an already loaded module for WScript.GetModuleNamespace";
        }
        else {
          errorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetModuleNamespace)
                                (*(JsModuleRecord *)(iVar3._M_node + 2),&local_28);
          errorMessage = L"";
          if (errorCode == JsErrorModuleNotEvaluated) {
            errorMessage = L"GetModuleNamespace called with un-evaluated module";
          }
        }
      }
    }
    AutoString::~AutoString((AutoString *)auStack_68);
  }
  SetExceptionIf(errorCode,errorMessage);
  return local_28;
}

Assistant:

JsValueRef __stdcall WScriptJsrt::GetModuleNamespace(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    JsErrorCode errorCode = JsNoError;
    JsValueRef returnValue = JS_INVALID_REFERENCE;
    LPCWSTR errorMessage = _u("");
    char fullPath[_MAX_PATH];

    if (argumentCount < 2)
    {
        errorCode = JsErrorInvalidArgument;
        errorMessage = _u("Need an argument for WScript.GetModuleNamespace");
    }
    else
    {
        AutoString specifierStr(arguments[1]);
        errorCode = specifierStr.GetError();

        if (errorCode == JsNoError)
        {
            if (_fullpath(fullPath, specifierStr.GetString(), _MAX_PATH) == nullptr)
            {
                errorCode = JsErrorInvalidArgument;
            }
            else
            {
                auto moduleEntry = moduleRecordMap.find(fullPath);
                if (moduleEntry == moduleRecordMap.end())
                {
                    errorCode = JsErrorInvalidArgument;
                    errorMessage = _u("Need to supply a path for an already loaded module for WScript.GetModuleNamespace");
                }
                else
                {
                    errorCode = ChakraRTInterface::JsGetModuleNamespace(moduleEntry->second, &returnValue);
                    if (errorCode == JsErrorModuleNotEvaluated)
                    {
                        errorMessage = _u("GetModuleNamespace called with un-evaluated module");
                    }
                }
            }
        }
    }

    SetExceptionIf(errorCode, errorMessage);
    return returnValue;
}